

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.h
# Opt level: O0

CompoundString * __thiscall
Js::CompoundString::Builder<256U>::CreateCompoundString(Builder<256U> *this,bool reserveMoreSpace)

{
  CharCount stringLength;
  CharCount directCharLength;
  CharCount usedCharLength;
  JavascriptLibrary *library;
  CompoundString *pCVar1;
  bool reserveMoreSpace_local;
  Builder<256U> *this_local;
  
  stringLength = this->stringLength;
  directCharLength = this->directCharLength;
  usedCharLength = this->charLength;
  library = GetLibrary(this);
  pCVar1 = CompoundString::New(stringLength,directCharLength,this,usedCharLength,reserveMoreSpace,
                               library);
  return pCVar1;
}

Assistant:

CompoundString *CompoundString::Builder<MinimumCharCapacity>::CreateCompoundString(const bool reserveMoreSpace) const
    {
        return
            CompoundString::New(
                stringLength,
                directCharLength,
                buffer,
                charLength,
                reserveMoreSpace,
                this->GetLibrary());
    }